

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::PipelineExecutor::Execute
          (PipelineExecutor *this,DataChunk *input,DataChunk *result,idx_t initial_idx)

{
  size_type __n;
  PhysicalOperator *op;
  uint uVar1;
  int operator_idx;
  reference pvVar2;
  optional_ptr<duckdb::DataChunk,_true> chunk;
  DataChunk *pDVar3;
  reference pvVar4;
  type pGVar5;
  reference this_00;
  type pOVar6;
  _Elt_pointer puVar7;
  InterruptException *this_01;
  PhysicalOperator *op_00;
  ulong uVar8;
  ulong local_78;
  deque<unsigned_long,std::allocator<unsigned_long>> *local_70;
  ulong local_68;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
  *local_60;
  DataChunk *local_58;
  DataChunk *local_50;
  PhysicalOperator *local_48;
  vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
  *local_40;
  ulong local_38;
  
  if (input->count == 0) {
    return NEED_MORE_INPUT;
  }
  local_70 = (deque<unsigned_long,std::allocator<unsigned_long>> *)&this->in_process_operators;
  puVar7 = (this->in_process_operators).c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  local_58 = input;
  local_50 = result;
  if (puVar7 != (this->in_process_operators).c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (puVar7 == (this->in_process_operators).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      puVar7 = (this->in_process_operators).c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    uVar8 = puVar7[-1];
    local_78 = uVar8;
    ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
    if (uVar8 != initial_idx) goto LAB_016cf71b;
  }
  uVar8 = initial_idx + 1;
  local_78 = uVar8;
LAB_016cf71b:
  if ((ulong)((long)(this->pipeline->operators).
                    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->pipeline->operators).
                    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) < uVar8) {
    DataChunk::Reference(local_50,local_58);
    return NEED_MORE_INPUT;
  }
  if (((((this->context).client)->interrupted)._M_base._M_i & 1U) == 0) {
    local_48 = (PhysicalOperator *)&this->context;
    local_60 = &this->intermediate_chunks;
    local_38 = initial_idx + 1;
    local_40 = &this->intermediate_states;
    local_68 = initial_idx;
    do {
      uVar8 = local_78;
      chunk.ptr = local_50;
      if (local_78 <
          (ulong)((long)(this->intermediate_chunks).
                        super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->intermediate_chunks).
                        super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        pvVar2 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                 ::operator[](local_60,local_78);
        chunk.ptr = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                    operator*(pvVar2);
      }
      DataChunk::Reset(chunk.ptr);
      if (local_78 == initial_idx) {
        return NEED_MORE_INPUT;
      }
      __n = uVar8 - 1;
      pDVar3 = local_58;
      if (uVar8 != local_38) {
        pvVar2 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                 ::operator[](local_60,__n);
        pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*(pvVar2);
      }
      pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                         (&this->pipeline->operators,local_78 - 1);
      op = pvVar4->_M_data;
      StartOperator(this,op);
      pGVar5 = unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>
               ::operator*(&op->op_state);
      this_00 = vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
                ::operator[](local_40,__n);
      pOVar6 = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>::
               operator*(this_00);
      op_00 = local_48;
      uVar1 = (*op->_vptr_PhysicalOperator[10])(op,local_48,pDVar3,chunk.ptr,pGVar5,pOVar6);
      EndOperator(this,op_00,chunk);
      initial_idx = local_68;
      if ((char)uVar1 == '\x01') {
        puVar7 = (this->in_process_operators).c.
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (puVar7 == (this->in_process_operators).c.
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_last + -1) {
          ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
          _M_push_back_aux<unsigned_long_const&>(local_70,&local_78);
        }
        else {
          *puVar7 = local_78;
          (this->in_process_operators).c.
          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur = puVar7 + 1;
        }
      }
      else if ((uVar1 & 0xff) == 2) {
        operator_idx = NumericCastImpl<int,_unsigned_long,_false>::Convert(local_78);
        FinishProcessing(this,operator_idx);
        return FINISHED;
      }
      DataChunk::Verify(chunk.ptr);
      if ((chunk.ptr)->count == 0) {
        if (local_78 == initial_idx) goto LAB_016cf988;
        local_78 = initial_idx;
        puVar7 = (this->in_process_operators).c.
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (puVar7 != (this->in_process_operators).c.
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur) {
          if (puVar7 == (this->in_process_operators).c.
                        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first) {
            puVar7 = (this->in_process_operators).c.
                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          local_78 = puVar7[-1];
          ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
        }
      }
      else {
        local_78 = local_78 + 1;
        if ((ulong)((long)(this->pipeline->operators).
                          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->pipeline->operators).
                          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) < local_78) {
LAB_016cf988:
          return (this->in_process_operators).c.
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur !=
                 (this->in_process_operators).c.
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        }
      }
    } while (((ulong)local_48->_vptr_PhysicalOperator[4] & 1) == 0);
  }
  this_01 = (InterruptException *)__cxa_allocate_exception(0x10);
  InterruptException::InterruptException(this_01);
  __cxa_throw(this_01,&InterruptException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

OperatorResultType PipelineExecutor::Execute(DataChunk &input, DataChunk &result, idx_t initial_idx) {
	if (input.size() == 0) { // LCOV_EXCL_START
		return OperatorResultType::NEED_MORE_INPUT;
	} // LCOV_EXCL_STOP
	D_ASSERT(!pipeline.operators.empty());

	idx_t current_idx;
	GoToSource(current_idx, initial_idx);
	if (current_idx == initial_idx) {
		current_idx++;
	}
	if (current_idx > pipeline.operators.size()) {
		result.Reference(input);
		return OperatorResultType::NEED_MORE_INPUT;
	}
	while (true) {
		if (context.client.interrupted) {
			throw InterruptException();
		}
		// now figure out where to put the chunk
		// if current_idx is the last possible index (>= operators.size()) we write to the result
		// otherwise we write to an intermediate chunk
		auto current_intermediate = current_idx;
		auto &current_chunk =
		    current_intermediate >= intermediate_chunks.size() ? result : *intermediate_chunks[current_intermediate];
		current_chunk.Reset();
		if (current_idx == initial_idx) {
			// we went back to the source: we need more input
			return OperatorResultType::NEED_MORE_INPUT;
		} else {
			auto &prev_chunk =
			    current_intermediate == initial_idx + 1 ? input : *intermediate_chunks[current_intermediate - 1];
			auto operator_idx = current_idx - 1;
			auto &current_operator = pipeline.operators[operator_idx].get();

			// if current_idx > source_idx, we pass the previous operators' output through the Execute of the current
			// operator
			StartOperator(current_operator);
			auto result = current_operator.Execute(context, prev_chunk, current_chunk, *current_operator.op_state,
			                                       *intermediate_states[current_intermediate - 1]);
			EndOperator(current_operator, &current_chunk);
			if (result == OperatorResultType::HAVE_MORE_OUTPUT) {
				// more data remains in this operator
				// push in-process marker
				in_process_operators.push(current_idx);
			} else if (result == OperatorResultType::FINISHED) {
				D_ASSERT(current_chunk.size() == 0);
				FinishProcessing(NumericCast<int32_t>(current_idx));
				return OperatorResultType::FINISHED;
			}
			current_chunk.Verify();
		}

		if (current_chunk.size() == 0) {
			// no output from this operator!
			if (current_idx == initial_idx) {
				// if we got no output from the scan, we are done
				break;
			} else {
				// if we got no output from an intermediate op
				// we go back and try to pull data from the source again
				GoToSource(current_idx, initial_idx);
				continue;
			}
		} else {
			// we got output! continue to the next operator
			current_idx++;
			if (current_idx > pipeline.operators.size()) {
				// if we got output and are at the last operator, we are finished executing for this output chunk
				// return the data and push it into the chunk
				break;
			}
		}
	}
	return in_process_operators.empty() ? OperatorResultType::NEED_MORE_INPUT : OperatorResultType::HAVE_MORE_OUTPUT;
}